

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

bool lpDimensionsOk(string *message,HighsLp *lp,HighsLogOptions *log_options)

{
  uint uVar1;
  uint uVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  HighsStatus HVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  vector<int,_std::allocator<int>_> a_matrix_p_end;
  vector<double,_std::allocator<double>_> *matrix_value;
  undefined8 uVar22;
  undefined4 uVar23;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar13 = lp->num_col_;
  uVar7 = lp->num_row_;
  if ((int)uVar13 < 0) {
    highsLogUser(log_options,kError,"LP dimension validation (%s) fails on num_col = %d >= 0\n",
                 (message->_M_dataplus)._M_p,(ulong)uVar13);
  }
  if ((int)uVar7 < 0) {
    highsLogUser(log_options,kError,"LP dimension validation (%s) fails on num_row = %d >= 0\n",
                 (message->_M_dataplus)._M_p);
  }
  if ((int)(uVar7 | uVar13) < 0) {
    return false;
  }
  uVar18 = (ulong)((long)(lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                  (long)(lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  uVar15 = (ulong)((long)(lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start) >> 3;
  uVar10 = (ulong)((long)(lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start) >> 3;
  iVar16 = (int)uVar18;
  if (iVar16 < (int)uVar13) {
    highsLogUser(log_options,kError,
                 "LP dimension validation (%s) fails on col_cost.size() = %d < %d = num_col\n",
                 (message->_M_dataplus)._M_p,uVar18 & 0xffffffff,(ulong)uVar13);
  }
  iVar14 = (int)uVar15;
  if (iVar14 < (int)uVar13) {
    highsLogUser(log_options,kError,
                 "LP dimension validation (%s) fails on col_lower.size() = %d < %d = num_col\n",
                 (message->_M_dataplus)._M_p,uVar15 & 0xffffffff,(ulong)uVar13);
  }
  iVar8 = (int)uVar10;
  if (iVar8 < (int)uVar13) {
    highsLogUser(log_options,kError,
                 "LP dimension validation (%s) fails on col_upper.size() = %d < %d = num_col\n",
                 (message->_M_dataplus)._M_p,uVar10 & 0xffffffff,(ulong)uVar13);
  }
  uVar11 = (lp->a_matrix_).format_ - kColwise;
  if (1 < uVar11) {
    highsLogUser(log_options,kError,"LP dimension validation (%s) fails on a_matrix_.format\n",
                 (message->_M_dataplus)._M_p);
  }
  bVar5 = HighsSparseMatrix::isColwise(&lp->a_matrix_);
  uVar1 = uVar7;
  if (bVar5) {
    uVar1 = uVar13;
  }
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  matrix_value = &(lp->a_matrix_).value_;
  HVar6 = assessMatrixDimensions
                    (log_options,uVar1,false,&(lp->a_matrix_).start_,&local_48,
                     &(lp->a_matrix_).index_,matrix_value);
  uVar23 = (undefined4)((ulong)matrix_value >> 0x20);
  if (HVar6 != kOk) {
    highsLogUser(log_options,kError,"LP dimension validation (%s) fails on a_matrix dimensions\n",
                 (message->_M_dataplus)._M_p);
  }
  pdVar3 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar10 = (ulong)((long)(lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start) >> 3;
  pdVar4 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar17 = (int)uVar10;
  if (iVar17 < (int)uVar7) {
    highsLogUser(log_options,kError,
                 "LP dimension validation (%s) fails on row_lower.size() = %d < %d = num_row\n",
                 (message->_M_dataplus)._M_p,uVar10 & 0xffffffff,(ulong)uVar7);
  }
  uVar10 = (ulong)((long)pdVar3 - (long)pdVar4) >> 3;
  iVar9 = (int)uVar10;
  if (iVar9 < (int)uVar7) {
    highsLogUser(log_options,kError,
                 "LP dimension validation (%s) fails on row_upper.size() = %d < %d = num_row\n",
                 (message->_M_dataplus)._M_p,uVar10 & 0xffffffff,(ulong)uVar7);
  }
  uVar1 = (lp->a_matrix_).num_col_;
  uVar2 = (lp->a_matrix_).num_row_;
  if (uVar1 == uVar13) {
    bVar5 = (((((int)uVar13 <= iVar8 && uVar11 < 2) &&
              ((int)uVar13 <= iVar16 && (int)uVar13 <= iVar14)) && HVar6 == kOk) &&
            (int)uVar7 <= iVar17) && (int)uVar7 <= iVar9;
  }
  else {
    bVar5 = false;
    highsLogUser(log_options,kError,
                 "LP dimension validation (%s) fails on a_matrix.num_col_ = %d != %d = num_col\n",
                 (message->_M_dataplus)._M_p,(ulong)uVar1,(ulong)uVar13);
  }
  if (uVar2 != uVar7) {
    bVar5 = false;
    highsLogUser(log_options,kError,
                 "LP dimension validation (%s) fails on a_matrix.num_row_ = %d != %d = num_row\n",
                 (message->_M_dataplus)._M_p,(ulong)(uint)(lp->a_matrix_).num_row_,(ulong)uVar7);
  }
  if ((lp->scale_).strategy < 0) {
    bVar5 = false;
    highsLogUser(log_options,kError,"LP dimension validation (%s) fails on scale_.scale_strategy\n",
                 (message->_M_dataplus)._M_p);
  }
  uVar10 = (ulong)((long)(lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start) >> 3;
  uVar15 = (ulong)((long)(lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start) >> 3;
  uVar11 = (lp->scale_).num_col;
  uVar1 = (lp->scale_).num_row;
  iVar16 = (int)uVar10;
  iVar14 = (int)uVar15;
  if ((lp->scale_).has_scaling == true) {
    bVar19 = uVar1 == uVar7;
    bVar20 = (int)uVar7 <= iVar16;
    bVar21 = (int)uVar13 <= iVar14;
    uVar18 = (ulong)uVar13;
    if (uVar11 != uVar13) {
LAB_0023dfa4:
      bVar5 = false;
      highsLogUser(log_options,kError,
                   "LP dimension validation (%s) fails on scale_.num_col = %d != %d\n",
                   (message->_M_dataplus)._M_p,(ulong)uVar11,uVar18);
    }
  }
  else {
    bVar19 = uVar1 == 0;
    bVar20 = iVar16 == 0;
    bVar21 = iVar14 == 0;
    uVar18 = 0;
    if (uVar11 != 0) goto LAB_0023dfa4;
  }
  if (!bVar19) {
    bVar5 = false;
    uVar18 = 0;
    if ((lp->scale_).has_scaling != false) {
      uVar18 = (ulong)uVar7;
    }
    highsLogUser(log_options,kError,
                 "LP dimension validation (%s) fails on scale_.num_row = %d != %d\n",
                 (message->_M_dataplus)._M_p,(ulong)(uint)(lp->scale_).num_row,uVar18);
  }
  if (bVar21) {
    if (bVar20) {
      bVar20 = true;
      if (bVar5) goto LAB_0023e0ea;
    }
    else {
LAB_0023e07f:
      pcVar12 = "==";
      if ((lp->scale_).has_scaling == false) {
        uVar7 = 0;
      }
      else {
        pcVar12 = ">=";
      }
      highsLogUser(log_options,kError,
                   "LP dimension validation (%s) fails on scale_.row.size() = %d %s %d\n",
                   (message->_M_dataplus)._M_p,uVar10 & 0xffffffff,pcVar12,CONCAT44(uVar23,uVar7));
    }
  }
  else {
    pcVar12 = "==";
    if ((lp->scale_).has_scaling == false) {
      uVar13 = 0;
    }
    else {
      pcVar12 = ">=";
    }
    uVar22 = CONCAT44(uVar23,uVar13);
    highsLogUser(log_options,kError,
                 "LP dimension validation (%s) fails on scale_.col.size() = %d %s %d\n",
                 (message->_M_dataplus)._M_p,uVar15 & 0xffffffff,pcVar12,uVar22);
    uVar23 = (undefined4)((ulong)uVar22 >> 0x20);
    if (!bVar20) goto LAB_0023e07f;
  }
  bVar20 = false;
  highsLogUser(log_options,kError,"LP dimension validation (%s) fails\n",(message->_M_dataplus)._M_p
              );
LAB_0023e0ea:
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar20;
}

Assistant:

bool lpDimensionsOk(std::string message, const HighsLp& lp,
                    const HighsLogOptions& log_options) {
  bool ok = true;
  const HighsInt num_col = lp.num_col_;
  const HighsInt num_row = lp.num_row_;
  if (!(num_col >= 0))
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on num_col = %d >= 0\n",
                 message.c_str(), (int)num_col);
  ok = num_col >= 0 && ok;
  if (!(num_row >= 0))
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on num_row = %d >= 0\n",
                 message.c_str(), (int)num_row);
  ok = num_row >= 0 && ok;
  if (!ok) return ok;

  HighsInt col_cost_size = lp.col_cost_.size();
  HighsInt col_lower_size = lp.col_lower_.size();
  HighsInt col_upper_size = lp.col_upper_.size();
  bool legal_col_cost_size = col_cost_size >= num_col;
  bool legal_col_lower_size = col_lower_size >= num_col;
  bool legal_col_upper_size = col_upper_size >= num_col;
  if (!legal_col_cost_size)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on col_cost.size() = %d < "
                 "%d = num_col\n",
                 message.c_str(), (int)col_cost_size, (int)num_col);
  ok = legal_col_cost_size && ok;
  if (!legal_col_lower_size)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on col_lower.size() = %d "
                 "< %d = num_col\n",
                 message.c_str(), (int)col_lower_size, (int)num_col);
  ok = legal_col_lower_size && ok;
  if (!legal_col_upper_size)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on col_upper.size() = %d "
                 "< %d = num_col\n",
                 message.c_str(), (int)col_upper_size, (int)num_col);
  ok = legal_col_upper_size && ok;

  bool legal_format = lp.a_matrix_.format_ == MatrixFormat::kColwise ||
                      lp.a_matrix_.format_ == MatrixFormat::kRowwise;
  if (!legal_format)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on a_matrix_.format\n",
                 message.c_str());
  ok = legal_format && ok;
  HighsInt num_vec;
  if (lp.a_matrix_.isColwise()) {
    num_vec = num_col;
  } else {
    num_vec = num_row;
  }
  const bool partitioned = false;
  vector<HighsInt> a_matrix_p_end;
  bool legal_matrix_dimensions =
      assessMatrixDimensions(log_options, num_vec, partitioned,
                             lp.a_matrix_.start_, a_matrix_p_end,
                             lp.a_matrix_.index_,
                             lp.a_matrix_.value_) == HighsStatus::kOk;
  if (!legal_matrix_dimensions)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on a_matrix dimensions\n",
                 message.c_str());
  ok = legal_matrix_dimensions && ok;

  HighsInt row_lower_size = lp.row_lower_.size();
  HighsInt row_upper_size = lp.row_upper_.size();
  bool legal_row_lower_size = row_lower_size >= num_row;
  bool legal_row_upper_size = row_upper_size >= num_row;
  if (!legal_row_lower_size)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on row_lower.size() = %d "
                 "< %d = num_row\n",
                 message.c_str(), (int)row_lower_size, (int)num_row);
  ok = legal_row_lower_size && ok;
  if (!legal_row_upper_size)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on row_upper.size() = %d "
                 "< %d = num_row\n",
                 message.c_str(), (int)row_upper_size, (int)num_row);
  ok = legal_row_upper_size && ok;

  bool legal_a_matrix_num_col = lp.a_matrix_.num_col_ == num_col;
  bool legal_a_matrix_num_row = lp.a_matrix_.num_row_ == num_row;
  if (!legal_a_matrix_num_col)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on a_matrix.num_col_ = %d "
                 "!= %d = num_col\n",
                 message.c_str(), (int)lp.a_matrix_.num_col_, (int)num_col);
  ok = legal_a_matrix_num_col && ok;
  if (!legal_a_matrix_num_row)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on a_matrix.num_row_ = %d "
                 "!= %d = num_row\n",
                 message.c_str(), (int)lp.a_matrix_.num_row_, (int)num_row);
  ok = legal_a_matrix_num_row && ok;

  HighsInt scale_strategy = (HighsInt)lp.scale_.strategy;
  bool legal_scale_strategy = scale_strategy >= 0;
  if (!legal_scale_strategy)
    highsLogUser(
        log_options, HighsLogType::kError,
        "LP dimension validation (%s) fails on scale_.scale_strategy\n",
        message.c_str());
  ok = legal_scale_strategy && ok;
  HighsInt scale_row_size = (HighsInt)lp.scale_.row.size();
  HighsInt scale_col_size = (HighsInt)lp.scale_.col.size();
  bool legal_scale_num_col = false;
  bool legal_scale_num_row = false;
  bool legal_scale_row_size = false;
  bool legal_scale_col_size = false;
  if (lp.scale_.has_scaling) {
    legal_scale_num_col = lp.scale_.num_col == num_col;
    legal_scale_num_row = lp.scale_.num_row == num_row;
    legal_scale_row_size = scale_row_size >= num_row;
    legal_scale_col_size = scale_col_size >= num_col;
  } else {
    legal_scale_num_col = lp.scale_.num_col == 0;
    legal_scale_num_row = lp.scale_.num_row == 0;
    legal_scale_row_size = scale_row_size == 0;
    legal_scale_col_size = scale_col_size == 0;
  }
  if (!legal_scale_num_col)
    highsLogUser(
        log_options, HighsLogType::kError,
        "LP dimension validation (%s) fails on scale_.num_col = %d != %d\n",
        message.c_str(), (int)lp.scale_.num_col,
        (int)(lp.scale_.has_scaling ? num_col : 0));
  ok = legal_scale_num_col && ok;
  if (!legal_scale_num_row)
    highsLogUser(
        log_options, HighsLogType::kError,
        "LP dimension validation (%s) fails on scale_.num_row = %d != %d\n",
        message.c_str(), (int)lp.scale_.num_row,
        (int)(lp.scale_.has_scaling ? num_row : 0));
  ok = legal_scale_num_row && ok;
  if (!legal_scale_col_size)
    highsLogUser(
        log_options, HighsLogType::kError,
        "LP dimension validation (%s) fails on scale_.col.size() = %d %s %d\n",
        message.c_str(), (int)scale_col_size,
        lp.scale_.has_scaling ? ">=" : "==",
        (int)(lp.scale_.has_scaling ? num_col : 0));
  ok = legal_scale_col_size && ok;
  if (!legal_scale_row_size)
    highsLogUser(
        log_options, HighsLogType::kError,
        "LP dimension validation (%s) fails on scale_.row.size() = %d %s %d\n",
        message.c_str(), (int)scale_row_size,
        lp.scale_.has_scaling ? ">=" : "==",
        (int)(lp.scale_.has_scaling ? num_row : 0));
  ok = legal_scale_row_size && ok;
  if (!ok) {
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails\n", message.c_str());
  }

  return ok;
}